

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::GridRenderCase::
genTessellationControlSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  char *pcVar2;
  ostringstream buf;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,
                  "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${PRIMITIVE_BOUNDING_BOX_REQUIRE}\nlayout(vertices=3) out;\n\nin highp vec4 vtx_color[];\nout highp vec4 tess_ctrl_color[];\nuniform highp float u_tessellationLevel;\nuniform highp vec4 u_posScale;\n"
                 );
  if (*(char *)((long)this + 0x83) == '\0') {
    std::operator<<((ostream *)local_190,
                    "uniform highp vec4 u_primitiveBBoxMin;\nuniform highp vec4 u_primitiveBBoxMax;\n"
                   );
  }
  std::operator<<((ostream *)local_190,
                  "patch out highp float vp_bbox_expansionSize;\npatch out highp vec3 vp_bbox_clipMin;\npatch out highp vec3 vp_bbox_clipMax;\n"
                 );
  if (*(char *)((long)this + 0x83) == '\x01') {
    std::operator<<((ostream *)local_190,"\n");
    if (*(char *)((long)this + 0x81) == '\x01') {
      std::operator<<((ostream *)local_190,
                      "vec4 mirrorX(in highp vec4 p)\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec2 patternCenter = patternOffset + patternScale * 0.5;\n\treturn vec4(2.0 * patternCenter.x - p.x, p.y, p.z, p.w);\n}\n"
                     );
    }
    std::operator<<((ostream *)local_190,
                    "vec4 mirrorY(in highp vec4 p)\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec2 patternCenter = patternOffset + patternScale * 0.5;\n\treturn vec4(p.x, 2.0 * patternCenter.y - p.y, p.z, p.w);\n}\n"
                   );
    poVar1 = std::operator<<((ostream *)local_190,"vec4 transformVec(in highp vec4 p)\n{\n\treturn "
                            );
    pcVar2 = "mirrorY(p)";
    if (*(char *)((long)this + 0x81) != '\0') {
      pcVar2 = "mirrorX(mirrorY(p))";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,";\n}\n");
  }
  std::operator<<((ostream *)local_190,
                  "\nvoid main()\n{\n\t// convert to nonsensical coordinates, just in case\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position.wzxy;\n\ttess_ctrl_color[gl_InvocationID] = vtx_color[gl_InvocationID];\n\n\tgl_TessLevelOuter[0] = u_tessellationLevel;\n\tgl_TessLevelOuter[1] = u_tessellationLevel;\n\tgl_TessLevelOuter[2] = u_tessellationLevel;\n\tgl_TessLevelInner[0] = u_tessellationLevel;\n"
                 );
  pcVar2 = 
  "\n\thighp vec4 bboxMin = u_primitiveBBoxMin;\n\thighp vec4 bboxMax = u_primitiveBBoxMax;\n";
  if (*(char *)((long)this + 0x83) != '\0') {
    pcVar2 = 
    "\n\thighp vec4 bboxMin = min(min(transformVec(gl_in[0].gl_Position),\n\t                             transformVec(gl_in[1].gl_Position)),\n\t                         transformVec(gl_in[2].gl_Position));\n\thighp vec4 bboxMax = max(max(transformVec(gl_in[0].gl_Position),\n\t                             transformVec(gl_in[1].gl_Position)),\n\t                         transformVec(gl_in[2].gl_Position));\n"
    ;
  }
  std::operator<<((ostream *)local_190,pcVar2);
  if (*(char *)((long)this + 0x82) == '\0') {
    std::operator<<((ostream *)local_190,
                    "\n\t${PRIM_GL_BOUNDING_BOX}[0] = bboxMin;\n\t${PRIM_GL_BOUNDING_BOX}[1] = bboxMax;\n"
                   );
  }
  std::operator<<((ostream *)local_190,
                  "\tvp_bbox_expansionSize = 0.0;\n\tvp_bbox_clipMin = min(vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMin.w,\n\t                      vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMax.w);\n\tvp_bbox_clipMax = max(vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMin.w,\n\t                      vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMax.w);\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string GridRenderCase::genTessellationControlSource (void) const
{
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${TESSELLATION_SHADER_REQUIRE}\n"
			"${PRIMITIVE_BOUNDING_BOX_REQUIRE}\n"
			"layout(vertices=3) out;\n"
			"\n"
			"in highp vec4 vtx_color[];\n"
			"out highp vec4 tess_ctrl_color[];\n"
			"uniform highp float u_tessellationLevel;\n"
			"uniform highp vec4 u_posScale;\n";

	if (!m_calcPerPrimitiveBBox)
	{
		buf <<	"uniform highp vec4 u_primitiveBBoxMin;\n"
				"uniform highp vec4 u_primitiveBBoxMax;\n";
	}

	buf <<	"patch out highp float vp_bbox_expansionSize;\n"
			"patch out highp vec3 vp_bbox_clipMin;\n"
			"patch out highp vec3 vp_bbox_clipMax;\n";

	if (m_calcPerPrimitiveBBox)
	{
		buf <<	"\n";
		if (m_hasGeometryStage)
			buf << genShaderFunction(SHADER_FUNC_MIRROR_X);
		buf << genShaderFunction(SHADER_FUNC_MIRROR_Y);

		buf <<	"vec4 transformVec(in highp vec4 p)\n"
				"{\n"
				"	return " << ((m_hasGeometryStage) ? ("mirrorX(mirrorY(p))") : ("mirrorY(p)")) << ";\n"
				"}\n";
	}

	buf <<	"\n"
			"void main()\n"
			"{\n"
			"	// convert to nonsensical coordinates, just in case\n"
			"	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position.wzxy;\n"
			"	tess_ctrl_color[gl_InvocationID] = vtx_color[gl_InvocationID];\n"
			"\n"
			"	gl_TessLevelOuter[0] = u_tessellationLevel;\n"
			"	gl_TessLevelOuter[1] = u_tessellationLevel;\n"
			"	gl_TessLevelOuter[2] = u_tessellationLevel;\n"
			"	gl_TessLevelInner[0] = u_tessellationLevel;\n";

	if (m_calcPerPrimitiveBBox)
	{
		buf <<	"\n"
				"	highp vec4 bboxMin = min(min(transformVec(gl_in[0].gl_Position),\n"
				"	                             transformVec(gl_in[1].gl_Position)),\n"
				"	                         transformVec(gl_in[2].gl_Position));\n"
				"	highp vec4 bboxMax = max(max(transformVec(gl_in[0].gl_Position),\n"
				"	                             transformVec(gl_in[1].gl_Position)),\n"
				"	                         transformVec(gl_in[2].gl_Position));\n";
	}
	else
	{
		buf <<	"\n"
				"	highp vec4 bboxMin = u_primitiveBBoxMin;\n"
				"	highp vec4 bboxMax = u_primitiveBBoxMax;\n";
	}

	if (!m_useGlobalState)
		buf <<	"\n"
				"	${PRIM_GL_BOUNDING_BOX}[0] = bboxMin;\n"
				"	${PRIM_GL_BOUNDING_BOX}[1] = bboxMax;\n";

	buf <<	"	vp_bbox_expansionSize = 0.0;\n"
			"	vp_bbox_clipMin = min(vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMin.w,\n"
			"	                      vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMax.w);\n"
			"	vp_bbox_clipMax = max(vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMin.w,\n"
			"	                      vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMax.w);\n"
			"}\n";

	return buf.str();
}